

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void set_restoration_unit_size(AV1_COMMON *cm,RestorationInfo *rsi,int is_uv,int luma_unit_size)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int vert_units;
  int horz_units;
  int plane_h;
  int plane_w;
  int unit_size;
  int s;
  int local_28;
  int local_24;
  int local_20;
  undefined4 local_1c;
  long local_10;
  
  local_1c = 0;
  local_20 = in_ECX;
  local_10 = in_RSI;
  av1_get_upsampled_plane_size(in_RDI,in_EDX,&local_24,&local_28);
  iVar1 = av1_lr_count_units(local_20,local_24);
  iVar2 = av1_lr_count_units(local_20,local_28);
  *(int *)(local_10 + 4) = local_20;
  *(int *)(local_10 + 8) = iVar1 * iVar2;
  *(int *)(local_10 + 0x10) = iVar1;
  *(int *)(local_10 + 0xc) = iVar2;
  return;
}

Assistant:

static void set_restoration_unit_size(AV1_COMMON *cm, RestorationInfo *rsi,
                                      int is_uv, int luma_unit_size) {
#if COUPLED_CHROMA_FROM_LUMA_RESTORATION
  int sx = cm->seq_params.subsampling_x;
  int sy = cm->seq_params.subsampling_y;
  int s = (p > 0) ? AOMMIN(sx, sy) : 0;
#else
  int s = 0;
#endif  // !COUPLED_CHROMA_FROM_LUMA_RESTORATION
  int unit_size = luma_unit_size >> s;

  int plane_w, plane_h;
  av1_get_upsampled_plane_size(cm, is_uv, &plane_w, &plane_h);

  const int horz_units = av1_lr_count_units(unit_size, plane_w);
  const int vert_units = av1_lr_count_units(unit_size, plane_h);

  rsi->restoration_unit_size = unit_size;
  rsi->num_rest_units = horz_units * vert_units;
  rsi->horz_units = horz_units;
  rsi->vert_units = vert_units;
}